

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int libssh2_session_supported_algs(LIBSSH2_SESSION *session,int method_type,char ***algs)

{
  uint uVar1;
  int iVar2;
  LIBSSH2_KEX_METHOD **ppLVar3;
  char **ppcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  int iStack_30;
  
  if (algs == (char ***)0x0) {
    pcVar8 = "algs must not be NULL";
LAB_0011e0f6:
    iStack_30 = -0x27;
  }
  else {
    switch(method_type) {
    case 0:
      ppLVar3 = libssh2_kex_methods;
      goto LAB_0011e124;
    case 1:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)libssh2_hostkey_methods();
      break;
    case 2:
    case 3:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)libssh2_crypt_methods();
      break;
    case 4:
    case 5:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)_libssh2_mac_methods();
      break;
    case 6:
    case 7:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)_libssh2_comp_methods(session);
      break;
    default:
      pcVar8 = "Unknown method type";
      iStack_30 = -0x21;
      goto LAB_0011e1c9;
    }
    if ((LIBSSH2_HOSTKEY_METHOD **)ppLVar3 != (LIBSSH2_HOSTKEY_METHOD **)0x0) {
LAB_0011e124:
      uVar9 = 0;
      for (uVar1 = 0; ((LIBSSH2_HOSTKEY_METHOD **)ppLVar3)[uVar1] != (LIBSSH2_HOSTKEY_METHOD *)0x0;
          uVar1 = uVar1 + 1) {
        uVar9 = (uVar9 + 1) -
                (uint)(((LIBSSH2_HOSTKEY_METHOD **)ppLVar3)[uVar1]->name == (char *)0x0);
      }
      if (uVar9 != 0) {
        ppcVar4 = (char **)(*session->alloc)((ulong)uVar9 << 3,&session->abstract);
        *algs = ppcVar4;
        if (ppcVar4 == (char **)0x0) {
          pcVar8 = "Memory allocation failed";
          iStack_30 = -6;
          goto LAB_0011e1c9;
        }
        uVar1 = 0;
        uVar6 = 0;
        while( true ) {
          uVar5 = (uint)uVar6;
          if ((((LIBSSH2_HOSTKEY_METHOD **)ppLVar3)[uVar1] == (LIBSSH2_HOSTKEY_METHOD *)0x0) ||
             (uVar9 <= uVar5)) break;
          pcVar8 = ((LIBSSH2_HOSTKEY_METHOD **)ppLVar3)[uVar1]->name;
          uVar7 = uVar6;
          if (pcVar8 != (char *)0x0) {
            uVar7 = (ulong)(uVar5 + 1);
            (*algs)[uVar6] = pcVar8;
          }
          uVar1 = uVar1 + 1;
          uVar6 = uVar7;
        }
        if (uVar5 == uVar9) {
          return uVar9;
        }
        (*session->free)(*algs,&session->abstract);
        *algs = (char **)0x0;
        pcVar8 = "Internal error";
        goto LAB_0011e0f6;
      }
    }
    pcVar8 = "No algorithm found";
    iStack_30 = -0x22;
  }
LAB_0011e1c9:
  iVar2 = _libssh2_error(session,iStack_30,pcVar8);
  return iVar2;
}

Assistant:

LIBSSH2_API int libssh2_session_supported_algs(LIBSSH2_SESSION* session,
                                               int method_type,
                                               const char*** algs)
{
    unsigned int i;
    unsigned int j;
    unsigned int ialg;
    const LIBSSH2_COMMON_METHOD **mlist;

    /* to prevent coredumps due to dereferencing of NULL */
    if (NULL == algs)
        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "algs must not be NULL");

    switch (method_type) {
    case LIBSSH2_METHOD_KEX:
        mlist = (const LIBSSH2_COMMON_METHOD **) libssh2_kex_methods;
        break;

    case LIBSSH2_METHOD_HOSTKEY:
        mlist = (const LIBSSH2_COMMON_METHOD **) libssh2_hostkey_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_CS:
    case LIBSSH2_METHOD_CRYPT_SC:
        mlist = (const LIBSSH2_COMMON_METHOD **) libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_MAC_CS:
    case LIBSSH2_METHOD_MAC_SC:
        mlist = (const LIBSSH2_COMMON_METHOD **) _libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_COMP_CS:
    case LIBSSH2_METHOD_COMP_SC:
        mlist = (const LIBSSH2_COMMON_METHOD **) _libssh2_comp_methods(session);
        break;

    default:
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unknown method type");
    }  /* switch */

    /* weird situation */
    if (NULL==mlist)
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "No algorithm found");

    /*
      mlist is looped through twice. The first time to find the number od
      supported algorithms (needed to allocate the proper size of array) and
      the second time to actually copy the pointers.  Typically this function
      will not be called often (typically at the beginning of a session) and
      the number of algorithms (i.e. niumber of iterations in one loop) will
      not be high (typically it will not exceed 20) for quite a long time.

      So double looping really shouldn't be an issue and it is definitely a
      better solution than reallocation several times.
    */

    /* count the number of supported algorithms */
    for ( i=0, ialg=0; NULL!=mlist[i]; i++) {
        /* do not count fields with NULL name */
        if (mlist[i]->name)
            ialg++;
    }

    /* weird situation, no algorithm found */
    if (0==ialg)
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "No algorithm found");

    /* allocate buffer */
    *algs = (const char**) LIBSSH2_ALLOC(session, ialg*sizeof(const char*));
    if ( NULL==*algs ) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Memory allocation failed");
    }
    /* Past this point *algs must be deallocated in case of an error!! */

    /* copy non-NULL pointers only */
    for ( i=0, j=0; NULL!=mlist[i] && j<ialg; i++ ) {
        if ( NULL==mlist[i]->name ){
            /* maybe a weird situation but if it occurs, do not include NULL
               pointers */
            continue;
        }

        /* note that [] has higher priority than * (dereferencing) */
        (*algs)[j++] = mlist[i]->name;
    }

    /* correct number of pointers copied? (test the code above) */
    if ( j!=ialg ) {
        /* deallocate buffer */
        LIBSSH2_FREE(session, (void *)*algs);
        *algs = NULL;

        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "Internal error");
    }

    return ialg;
}